

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O2

void __thiscall HighsMipSolverData::printSolutionSourceKey(HighsMipSolverData *this)

{
  HighsOptions *pHVar1;
  ostream *poVar2;
  int k;
  int iVar3;
  long lVar4;
  char *pcVar5;
  HighsMipSolverData *this_00;
  initializer_list<int> __l;
  string local_218;
  HighsMipSolverData *local_1f8;
  vector<int,_std::allocator<int>_> limits;
  string local_1d8;
  stringstream ss;
  undefined1 local_1a8 [376];
  
  local_1f8 = this;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  local_218._M_dataplus._M_p = (pointer)0xa00000005;
  local_218._M_string_length = CONCAT44(local_218._M_string_length._4_4_,0xf);
  __l._M_len = 3;
  __l._M_array = (iterator)&local_218;
  std::vector<int,_std::allocator<int>_>::vector(&limits,__l,(allocator_type *)&local_1d8);
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  local_218._M_string_length = 0;
  local_218.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
  std::__cxx11::string::~string((string *)&local_218);
  for (iVar3 = 0;
      iVar3 < *limits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start; iVar3 = iVar3 + 1) {
    pcVar5 = "; ";
    if (iVar3 == 0) {
      pcVar5 = "\nSrc: ";
    }
    std::operator<<((ostream *)local_1a8,pcVar5);
    solutionSourceToString_abi_cxx11_(&local_218,(HighsMipSolverData *)pcVar5,iVar3,true);
    poVar2 = std::operator<<((ostream *)local_1a8,(string *)&local_218);
    pcVar5 = " => ";
    poVar2 = std::operator<<(poVar2," => ");
    solutionSourceToString_abi_cxx11_(&local_1d8,(HighsMipSolverData *)pcVar5,iVar3,false);
    std::operator<<(poVar2,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_218);
  }
  pHVar1 = local_1f8->mipsolver->options_mip_;
  std::__cxx11::stringbuf::str();
  highsLogUser(&(pHVar1->super_HighsOptionsStruct).log_options,kInfo,"%s;\n",
               local_218._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_218);
  lVar4 = 0;
  while (lVar4 != 2) {
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    local_218._M_string_length = 0;
    local_218.field_2._M_local_buf[0] = '\0';
    std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
    std::__cxx11::string::~string((string *)&local_218);
    for (iVar3 = limits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar4];
        iVar3 < limits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start[lVar4 + 1]; iVar3 = iVar3 + 1) {
      this_00 = (HighsMipSolverData *)0x3a7a21;
      if (iVar3 == limits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar4]) {
        this_00 = (HighsMipSolverData *)0x3b3bc3;
      }
      std::operator<<((ostream *)local_1a8,(char *)this_00);
      solutionSourceToString_abi_cxx11_(&local_218,this_00,iVar3,true);
      poVar2 = std::operator<<((ostream *)local_1a8,(string *)&local_218);
      pcVar5 = " => ";
      poVar2 = std::operator<<(poVar2," => ");
      solutionSourceToString_abi_cxx11_(&local_1d8,(HighsMipSolverData *)pcVar5,iVar3,false);
      std::operator<<(poVar2,(string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_218);
    }
    pHVar1 = local_1f8->mipsolver->options_mip_;
    std::__cxx11::stringbuf::str();
    pcVar5 = "";
    if (lVar4 == 0) {
      pcVar5 = ";";
    }
    highsLogUser(&(pHVar1->super_HighsOptionsStruct).log_options,kInfo,"%s%s\n",
                 local_218._M_dataplus._M_p,pcVar5);
    std::__cxx11::string::~string((string *)&local_218);
    lVar4 = lVar4 + 1;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&limits.super__Vector_base<int,_std::allocator<int>_>);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return;
}

Assistant:

void HighsMipSolverData::printSolutionSourceKey() {
  std::stringstream ss;
  // Last MipSolutionSource enum is kSolutionSourceCleanup - which is
  // not a solution source, but used to force the last logging line to
  // be printed
  const int last_enum = kSolutionSourceCount - 1;
  int third_list = 5;
  int two_third_list = 10;
  std::vector<int> limits = {third_list, two_third_list, last_enum};

  ss.str(std::string());
  for (int k = 0; k < limits[0]; k++) {
    if (k == 0) {
      ss << "\nSrc: ";
    } else {
      ss << "; ";
    }
    ss << solutionSourceToString(k) << " => "
       << solutionSourceToString(k, false);
  }
  highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
               "%s;\n", ss.str().c_str());
  for (int line = 0; line < 2; line++) {
    ss.str(std::string());
    for (int k = limits[line]; k < limits[line + 1]; k++) {
      if (k == limits[line]) {
        ss << "     ";
      } else {
        ss << "; ";
      }
      ss << solutionSourceToString(k) << " => "
         << solutionSourceToString(k, false);
    }
    highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                 "%s%s\n", ss.str().c_str(), line == 0 ? ";" : "");
  }
}